

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.c
# Opt level: O0

void use_bell(obj **optr)

{
  obj *obj_00;
  boolean bVar1;
  int iVar2;
  char *pcVar3;
  permonst *ptr;
  bool bVar4;
  byte local_2e;
  byte local_2d;
  uint local_2c;
  coord local_26;
  int res;
  coord mm;
  boolean invoking;
  boolean ordinary;
  boolean learno;
  monst *pmStack_20;
  boolean wakem;
  monst *mtmp;
  obj *obj;
  obj **optr_local;
  
  obj_00 = *optr;
  res._3_1_ = '\0';
  res._2_1_ = '\0';
  local_2d = 1;
  if (obj_00->otyp == 0x10c) {
    local_2d = obj_00->spe != '\0' ^ 0xff;
  }
  res._1_1_ = local_2d & 1;
  local_2e = 0;
  if (obj_00->otyp == 0x10c) {
    bVar1 = invocation_pos(&u.uz,u.ux,u.uy);
    local_2e = 0;
    if (bVar1 != '\0') {
      bVar1 = On_stairs(u.ux,u.uy);
      local_2e = bVar1 != '\0' ^ 0xff;
    }
  }
  res._0_1_ = local_2e & 1;
  pcVar3 = xname(obj_00);
  pcVar3 = the(pcVar3);
  pline("You ring %s.",pcVar3);
  if ((((byte)u._1052_1_ >> 1 & 1) == 0) && (((u._1052_1_ & 1) == 0 || (res._1_1_ == 0)))) {
    if (((byte)res == 0) || (res._1_1_ == 0)) {
      if (res._1_1_ == 0) {
        consume_obj_charge(obj_00,'\x01');
        if ((u._1052_1_ & 1) == 0) {
          if ((*(uint *)&obj_00->field_0x4a & 1) == 0) {
            if ((byte)res == 0) {
              if ((*(uint *)&obj_00->field_0x4a >> 1 & 1) == 0) {
                iVar2 = findit();
                if (iVar2 == 0) {
                  pline("Nothing happens.");
                }
                else {
                  res._2_1_ = '\x01';
                }
              }
              else {
                bVar4 = uchain != (obj *)0x0;
                if (bVar4) {
                  unpunish();
                }
                local_2c = (uint)bVar4;
                iVar2 = openit();
                if (local_2c + iVar2 == 0) {
                  pline("Nothing happens.");
                }
                else if (local_2c + iVar2 == 1) {
                  pline("Something opens...");
                  res._2_1_ = '\x01';
                }
                else {
                  pline("Things open around you...");
                  res._2_1_ = '\x01';
                }
              }
            }
            else {
              pcVar3 = Tobjnam(obj_00,"issue");
              pline("%s an unsettling shrill sound...",pcVar3);
              obj_00->age = moves;
              res._2_1_ = '\x01';
              res._3_1_ = '\x01';
            }
          }
          else {
            local_26.x = u.ux;
            local_26.y = u.uy;
            mkundead(level,&local_26,'\0',1);
            res._3_1_ = '\x01';
          }
        }
        else if ((*(uint *)&obj_00->field_0x4a & 1) == 0) {
          openit();
        }
        else {
          pline("Nothing happens.");
        }
      }
      else {
        if (((((*(uint *)&obj_00->field_0x4a & 1) != 0) && (iVar2 = rn2(4), iVar2 == 0)) &&
            ((mvitals[0x44].mvflags & 3) == 0)) &&
           (((mvitals[0x45].mvflags & 3) == 0 && ((mvitals[0x46].mvflags & 3) == 0)))) {
          ptr = mkclass(&u.uz,'\x0e',0);
          pmStack_20 = makemon(ptr,level,(int)u.ux,(int)u.uy,1);
          if (pmStack_20 != (monst *)0x0) {
            pcVar3 = a_monnam(pmStack_20);
            pline("You summon %s!",pcVar3);
            bVar1 = obj_resists(obj_00,0x5d,100);
            if (bVar1 == '\0') {
              pcVar3 = Tobjnam(obj_00,"have");
              pline("%s shattered!",pcVar3);
              useup(obj_00);
              *optr = (obj *)0x0;
            }
            else {
              iVar2 = rn2(3);
              if (iVar2 == 1) {
                mon_adjust_speed(pmStack_20,2,(obj *)0x0);
              }
              else if (iVar2 == 2) {
                nomovemsg = "";
                iVar2 = rnd(2);
                nomul(-iVar2,(char *)0x0);
              }
            }
          }
        }
        res._3_1_ = '\x01';
      }
    }
    else {
      pline("But it makes no sound.");
      res._2_1_ = '\x01';
    }
  }
  else {
    pline("But the sound is muffled.");
  }
  if (res._2_1_ != '\0') {
    discover_object(0x10c,'\x01','\x01');
    *(uint *)&obj_00->field_0x4a = *(uint *)&obj_00->field_0x4a & 0xffffffef | 0x10;
  }
  if (res._3_1_ != '\0') {
    wake_nearby();
  }
  return;
}

Assistant:

static void use_bell(struct obj **optr)
{
	struct obj *obj = *optr;
	struct monst *mtmp;
	boolean wakem = FALSE, learno = FALSE,
		ordinary = (obj->otyp != BELL_OF_OPENING || !obj->spe),
		invoking = (obj->otyp == BELL_OF_OPENING &&
			 invocation_pos(&u.uz, u.ux, u.uy) && !On_stairs(u.ux, u.uy));

	pline("You ring %s.", the(xname(obj)));

	if (Underwater || (u.uswallow && ordinary)) {
	    pline("But the sound is muffled.");

	} else if (invoking && ordinary) {
	    /* needs to be recharged... */
	    pline("But it makes no sound.");
	    learno = TRUE;	/* help player figure out why */

	} else if (ordinary) {
	    if (obj->cursed && !rn2(4) &&
		    /* note: once any of them are gone, we stop all of them */
		    !(mvitals[PM_WOOD_NYMPH].mvflags & G_GONE) &&
		    !(mvitals[PM_WATER_NYMPH].mvflags & G_GONE) &&
		    !(mvitals[PM_MOUNTAIN_NYMPH].mvflags & G_GONE) &&
		    (mtmp = makemon(mkclass(&u.uz, S_NYMPH, 0), level,
					u.ux, u.uy, NO_MINVENT)) != 0) {
		pline("You summon %s!", a_monnam(mtmp));
		if (!obj_resists(obj, 93, 100)) {
		    pline("%s shattered!", Tobjnam(obj, "have"));
		    useup(obj);
		    *optr = 0;
		} else switch (rn2(3)) {
			default:
				break;
			case 1:
				mon_adjust_speed(mtmp, 2, NULL);
				break;
			case 2: /* no explanation; it just happens... */
				nomovemsg = "";
				nomul(-rnd(2), NULL);
				break;
		}
	    }
	    wakem = TRUE;

	} else {
	    /* charged Bell of Opening */
	    consume_obj_charge(obj, TRUE);

	    if (u.uswallow) {
		if (!obj->cursed)
		    openit();
		else
		    pline("Nothing happens.");

	    } else if (obj->cursed) {
		coord mm;

		mm.x = u.ux;
		mm.y = u.uy;
		mkundead(level, &mm, FALSE, NO_MINVENT);
		wakem = TRUE;

	    } else  if (invoking) {
		pline("%s an unsettling shrill sound...",
		      Tobjnam(obj, "issue"));
		obj->age = moves;
		learno = TRUE;
		wakem = TRUE;

	    } else if (obj->blessed) {
		int res = 0;

		if (uchain) {
		    unpunish();
		    res = 1;
		}
		res += openit();
		switch (res) {
		  case 0:  pline("Nothing happens."); break;
		  case 1:  pline("Something opens...");
			   learno = TRUE; break;
		  default: pline("Things open around you...");
			   learno = TRUE; break;
		}

	    } else {  /* uncursed */
		if (findit() != 0) learno = TRUE;
		else pline("Nothing happens.");
	    }

	}	/* charged BofO */

	if (learno) {
	    makeknown(BELL_OF_OPENING);
	    obj->known = 1;
	}
	if (wakem) wake_nearby();
}